

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O1

void dirINCLUDE(void)

{
  char cVar1;
  fullpath_ref_t nfilename;
  
  nfilename = GetInputFile(&lp);
  cVar1 = std::filesystem::__cxx11::path::has_filename();
  if (cVar1 != '\0') {
    ListFile(false);
    IncludeFile(nfilename);
    donotlist = 1;
    return;
  }
  Error("[INCLUDE] empty filename",bp,PASS3);
  return;
}

Assistant:

static void dirINCLUDE() {
	fullpath_ref_t fnaam = GetInputFile(lp);
	if (fnaam.full.has_filename()) {
		ListFile();
		IncludeFile(fnaam);
		donotlist = 1;
	} else {
		Error("[INCLUDE] empty filename", bp);
	}
}